

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaDup.c
# Opt level: O2

Gia_Man_t * Gia_ManDupPermFlopGap(Gia_Man_t *p,Vec_Int_t *vFfMask)

{
  int Entry;
  Vec_Int_t *vFfPerm;
  Gia_Man_t *p_00;
  Gia_Man_t *pGVar1;
  int i;
  
  vFfPerm = Vec_IntAlloc(vFfMask->nSize);
  for (i = 0; i < vFfMask->nSize; i = i + 1) {
    Entry = Vec_IntEntry(vFfMask,i);
    if (Entry != -1) {
      Vec_IntPush(vFfPerm,Entry);
    }
  }
  p_00 = Gia_ManDupPermFlop(p,vFfPerm);
  pGVar1 = Gia_ManDupSpreadFlop(p_00,vFfMask);
  Vec_IntFree(vFfPerm);
  Gia_ManStop(p_00);
  return pGVar1;
}

Assistant:

Gia_Man_t * Gia_ManDupPermFlopGap( Gia_Man_t * p, Vec_Int_t * vFfMask )
{
    Vec_Int_t * vPerm = Vec_IntCondense( vFfMask, -1 );
    Gia_Man_t * pPerm = Gia_ManDupPermFlop( p, vPerm );
    Gia_Man_t * pSpread = Gia_ManDupSpreadFlop( pPerm, vFfMask );
    Vec_IntFree( vPerm );
    Gia_ManStop( pPerm );
    return pSpread;
}